

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CharItem.cpp
# Opt level: O1

string * __thiscall
Hpipe::CharItem::compact_repr_abi_cxx11_(string *__return_storage_ptr__,CharItem *this)

{
  char cVar1;
  pointer pcVar2;
  bool bVar3;
  size_type sVar4;
  mapped_type *pmVar5;
  char *pcVar6;
  pointer pcVar7;
  mapped_type mVar8;
  CharItem *local_28;
  
  if (compact_repr[abi:cxx11]()::d == '\0') {
    compact_repr_abi_cxx11_();
  }
  local_28 = this;
  sVar4 = std::
          _Hashtable<const_Hpipe::CharItem_*,_std::pair<const_Hpipe::CharItem_*const,_unsigned_int>,_std::allocator<std::pair<const_Hpipe::CharItem_*const,_unsigned_int>_>,_std::__detail::_Select1st,_std::equal_to<const_Hpipe::CharItem_*>,_std::hash<const_Hpipe::CharItem_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
          ::count(&compact_repr::d._M_h,&local_28);
  mVar8 = (mapped_type)compact_repr::d._M_h._M_element_count;
  if (sVar4 == 0) {
    local_28 = this;
    pmVar5 = std::__detail::
             _Map_base<const_Hpipe::CharItem_*,_std::pair<const_Hpipe::CharItem_*const,_unsigned_int>,_std::allocator<std::pair<const_Hpipe::CharItem_*const,_unsigned_int>_>,_std::__detail::_Select1st,_std::equal_to<const_Hpipe::CharItem_*>,_std::hash<const_Hpipe::CharItem_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
             ::operator[]((_Map_base<const_Hpipe::CharItem_*,_std::pair<const_Hpipe::CharItem_*const,_unsigned_int>,_std::allocator<std::pair<const_Hpipe::CharItem_*const,_unsigned_int>_>,_std::__detail::_Select1st,_std::equal_to<const_Hpipe::CharItem_*>,_std::hash<const_Hpipe::CharItem_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                           *)&compact_repr::d,&local_28);
    *pmVar5 = mVar8;
  }
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  __return_storage_ptr__->_M_string_length = 0;
  (__return_storage_ptr__->field_2)._M_local_buf[0] = '\0';
  local_28 = this;
  pmVar5 = std::__detail::
           _Map_base<const_Hpipe::CharItem_*,_std::pair<const_Hpipe::CharItem_*const,_unsigned_int>,_std::allocator<std::pair<const_Hpipe::CharItem_*const,_unsigned_int>_>,_std::__detail::_Select1st,_std::equal_to<const_Hpipe::CharItem_*>,_std::hash<const_Hpipe::CharItem_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
           ::operator[]((_Map_base<const_Hpipe::CharItem_*,_std::pair<const_Hpipe::CharItem_*const,_unsigned_int>,_std::allocator<std::pair<const_Hpipe::CharItem_*const,_unsigned_int>_>,_std::__detail::_Select1st,_std::equal_to<const_Hpipe::CharItem_*>,_std::hash<const_Hpipe::CharItem_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                         *)&compact_repr::d,&local_28);
  mVar8 = *pmVar5;
  if (*pmVar5 == 0) {
    std::__cxx11::string::_M_replace_aux
              ((ulong)__return_storage_ptr__,0,__return_storage_ptr__->_M_string_length,'\x01');
  }
  else {
    do {
      std::__cxx11::string::push_back((char)__return_storage_ptr__);
      bVar3 = 0x19 < mVar8;
      mVar8 = mVar8 / 0x1a;
    } while (bVar3);
    pcVar2 = (__return_storage_ptr__->_M_dataplus)._M_p;
    pcVar7 = pcVar2 + (__return_storage_ptr__->_M_string_length - 1);
    if (pcVar2 < pcVar7 && __return_storage_ptr__->_M_string_length != 0) {
      do {
        pcVar6 = pcVar2 + 1;
        cVar1 = *pcVar2;
        *pcVar2 = *pcVar7;
        *pcVar7 = cVar1;
        pcVar7 = pcVar7 + -1;
        pcVar2 = pcVar6;
      } while (pcVar6 < pcVar7);
    }
  }
  return __return_storage_ptr__;
}

Assistant:

std::string CharItem::compact_repr() const {
    static std::unordered_map<const CharItem *,unsigned> d;
    if ( not d.count( this ) )
        d[ this ] = d.size();
    std::string res;
    unsigned c = d[ this ];
    if ( not c )
        res = '0';
    else {
        while ( c ) {
            res += 'a' + c % 26;
            c /= 26;
        }
        std::reverse( res.begin(), res.end() );
    }
    return res;
}